

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_set.hpp
# Opt level: O0

set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> * __thiscall
burst::make_set<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
          (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
           *__return_storage_ptr__,burst *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *values)

{
  const_iterator __first;
  const_iterator __last;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *values_local;
  
  __first = std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  __last = std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
  set<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)
             __return_storage_ptr__,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first._M_current,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__last._M_current);
  return __return_storage_ptr__;
}

Assistant:

auto make_set (InputRange && values)
    {
        using std::begin;
        using std::end;
        return
            std::set<Value>
            (
                begin(std::forward<InputRange>(values)),
                end(std::forward<InputRange>(values))
            );
    }